

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_pubnonce_parse
              (secp256k1_context *ctx,secp256k1_musig_pubnonce *nonce,uchar *in66)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  secp256k1_ge *elem;
  secp256k1_ge ges [2];
  secp256k1_ge sStack_108;
  secp256k1_ge local_a0;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_musig_pubnonce_parse_cold_3();
  }
  else if (nonce != (secp256k1_musig_pubnonce *)0x0) {
    if (in66 == (uchar *)0x0) {
      secp256k1_musig_pubnonce_parse_cold_1();
      return 0;
    }
    lVar4 = 0;
    elem = &sStack_108;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      iVar2 = secp256k1_eckey_pubkey_parse(elem,in66 + lVar4,0x21);
      if (iVar2 == 0) {
        return 0;
      }
      secp256k1_ge_verify(elem);
      lVar4 = 0x21;
      elem = &local_a0;
      bVar1 = false;
    } while (bVar3);
    nonce->data[0] = 0xf5;
    nonce->data[1] = 'z';
    nonce->data[2] = '=';
    nonce->data[3] = 0xa0;
    secp256k1_ge_to_bytes(nonce->data + 4,&sStack_108);
    secp256k1_ge_to_bytes(nonce->data + 0x44,&local_a0);
    return 1;
  }
  secp256k1_musig_pubnonce_parse_cold_2();
  return 0;
}

Assistant:

int secp256k1_musig_pubnonce_parse(const secp256k1_context* ctx, secp256k1_musig_pubnonce* nonce, const unsigned char *in66) {
    secp256k1_ge ges[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(in66 != NULL);

    for (i = 0; i < 2; i++) {
        if (!secp256k1_eckey_pubkey_parse(&ges[i], &in66[33*i], 33)) {
            return 0;
        }
        if (!secp256k1_ge_is_in_correct_subgroup(&ges[i])) {
            return 0;
        }
    }
    secp256k1_musig_pubnonce_save(nonce, ges);
    return 1;
}